

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_WFI(DisasContext_conflict1 *s,arg_WFI *a)

{
  arg_WFI *a_local;
  DisasContext_conflict1 *s_local;
  
  gen_set_pc_im(s,(s->base).pc_next);
  (s->base).is_jmp = DISAS_TARGET_2;
  return true;
}

Assistant:

static bool trans_WFI(DisasContext *s, arg_WFI *a)
{
    /* For WFI, halt the vCPU until an IRQ. */
    gen_set_pc_im(s, s->base.pc_next);
    s->base.is_jmp = DISAS_WFI;
    return true;
}